

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

bool __thiscall cmPolicies::PolicyMap::IsDefined(PolicyMap *this,PolicyID id)

{
  bool bVar1;
  undefined1 local_15;
  PolicyID id_local;
  PolicyMap *this_local;
  
  bVar1 = std::bitset<288UL>::operator[](&this->Status,(long)(int)(id * 3));
  local_15 = true;
  if (!bVar1) {
    bVar1 = std::bitset<288UL>::operator[](&this->Status,(long)(int)(id * 3 + 1));
    local_15 = true;
    if (!bVar1) {
      local_15 = std::bitset<288UL>::operator[](&this->Status,(long)(int)(id * 3 + 2));
    }
  }
  return local_15;
}

Assistant:

bool cmPolicies::PolicyMap::IsDefined(cmPolicies::PolicyID id) const
{
  return this->Status[(POLICY_STATUS_COUNT * id) + OLD] ||
    this->Status[(POLICY_STATUS_COUNT * id) + WARN] ||
    this->Status[(POLICY_STATUS_COUNT * id) + NEW];
}